

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  _func_int ***ppp_Var1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  execution_context eVar4;
  service *psVar5;
  string message;
  io_context io_context;
  error_code ignored_error;
  socket client;
  acceptor acceptor;
  undefined1 local_148 [32];
  io_context local_128;
  address local_118;
  undefined1 local_f8 [32];
  object_type local_d8;
  undefined1 *local_c8;
  object_type *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  data_union local_a8;
  data_union *local_88;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  local_80;
  
  signal(2,main::anon_class_1_0_00000001::__invoke);
  asio::io_context::io_context(&local_128);
  local_f8[8] = '\0';
  local_f8[9] = '\0';
  local_f8[10] = '\0';
  local_f8[0xb] = '\0';
  local_f8[0xc] = '\0';
  local_f8[0xd] = '\0';
  local_f8[0xe] = '\0';
  local_f8[0xf] = '\0';
  local_f8._16_8_ = 0;
  local_f8._24_4_ = 0;
  local_f8._0_8_ = 0xc3220002;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)&local_80,&local_128,
             (endpoint_type *)local_f8,true,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"loccal addr info: \n addr: ",0x1a);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
            ((endpoint_type *)local_148,
             (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)&local_80);
  if (local_148._0_2_ != 2) {
    local_f8._8_8_ = local_148._8_8_;
    local_f8._16_8_ = local_148._16_8_;
    local_f8._24_4_ = local_148._24_4_;
    local_f8._4_4_ = 0;
  }
  else {
    local_f8[8] = '\0';
    local_f8[9] = '\0';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8._16_8_ = 0;
    local_f8._24_4_ = 0;
    local_f8._4_4_ = local_148._4_4_;
  }
  local_f8._1_3_ = 0;
  local_f8[0] = local_148._0_2_ != 2;
  pbVar2 = asio::ip::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,(address *)local_f8
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar2 + -0x18) + (char)pbVar2);
  std::ostream::put((char)pbVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"port: ",6);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::local_endpoint
            ((endpoint_type *)local_f8,
             (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)&local_80);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (((byte)g_running._M_base._M_i & 1) != 0) {
    do {
      local_148._0_8_ =
           &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::
            typeinfo;
      local_148[8] = '\0';
      local_148[9] = '\0';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_f8._0_8_ =
           asio::detail::service_registry::do_use_service
                     (local_128.super_execution_context.service_registry_,(key *)local_148,
                      asio::detail::service_registry::
                      create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                      &local_128);
      local_f8._24_4_ = 2;
      local_b8 = asio::execution::detail::any_executor_base::
                 target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
                 ::fns_with_execute;
      local_c8 = asio::execution::detail::any_executor_base::
                 object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
                 ::fns;
      local_d8._12_4_ = 0;
      local_c0 = &local_d8;
      local_b0 = asio::execution::
                 any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                 ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()
                 ::fns;
      local_f8._8_5_ = 0xffffffff;
      local_d8.__align = (anon_struct_8_0_00000001_for___align)&local_128;
      asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
      accept<asio::ip::tcp,asio::any_io_executor>
                ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)&local_80,
                 (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)local_f8,0);
      make_daytime_string_abi_cxx11_();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"msg : ",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_148._0_8_,local_148._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"peer client addr = ",0x13);
      asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
                ((endpoint_type *)&local_a8.base,
                 (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)local_f8);
      if (local_a8.base.sa_family != 2) {
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_a8.base.sa_data[6];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_a8.base.sa_data[7];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_a8.base.sa_data[8];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_a8.base.sa_data[9];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_a8.base.sa_data[10];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_a8.base.sa_data[0xb];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_a8.base.sa_data[0xc];
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_a8.base.sa_data[0xd];
        local_118.ipv6_address_.addr_.__in6_u._8_8_ = local_a8._16_8_;
        local_118.ipv6_address_.scope_id_ = local_a8.v6.sin6_scope_id;
        local_118.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
        local_118.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
        local_118.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_118.ipv6_address_.scope_id_ = 0;
        local_118.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(in4_addr_type)local_a8.v6.sin6_flowinfo;
      }
      local_118.type_ = (anon_enum_32)(local_a8.base.sa_family != 2);
      pbVar2 = asio::ip::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_118);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar2 + -0x18) + (char)pbVar2);
      std::ostream::put((char)pbVar2);
      std::ostream::flush();
      local_118.type_ = ipv4;
      local_118.ipv6_address_.addr_.__in6_u._0_8_ = std::_V2::system_category();
      local_a8._0_8_ = local_148._8_8_;
      if ((uchar  [8])local_148._8_8_ != (uchar  [8])0x0) {
        local_a8._0_8_ = local_148._0_8_;
      }
      local_a8.base.sa_data[6] = local_148[8];
      local_a8.base.sa_data[7] = local_148[9];
      local_a8.base.sa_data[8] = local_148[10];
      local_a8.base.sa_data[9] = local_148[0xb];
      local_a8.base.sa_data[10] = local_148[0xc];
      local_a8.base.sa_data[0xb] = local_148[0xd];
      local_a8.base.sa_data[0xc] = local_148[0xe];
      local_a8.base.sa_data[0xd] = local_148[0xf];
      local_88 = &local_a8;
      asio::detail::
      write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                ((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                  *)local_f8,&local_a8,&local_88,&local_118);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_);
      }
      asio::detail::
      io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
      ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                       *)local_f8);
    } while (((byte)g_running._M_base._M_i & 1) != 0);
  }
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&local_80);
  psVar5 = (local_128.super_execution_context.service_registry_)->first_service_;
  eVar4.service_registry_ = local_128.super_execution_context.service_registry_;
  if (psVar5 != (service *)0x0) {
    do {
      (*psVar5->_vptr_service[2])(psVar5);
      eVar4.service_registry_ = local_128.super_execution_context.service_registry_;
      psVar5 = psVar5->next_;
    } while (psVar5 != (service *)0x0);
    psVar5 = (local_128.super_execution_context.service_registry_)->first_service_;
    if (psVar5 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar5->_vptr_service;
        psVar5 = psVar5->next_;
        (*(*ppp_Var1)[1])();
        (eVar4.service_registry_)->first_service_ = psVar5;
      } while (psVar5 != (service *)0x0);
      eVar4.service_registry_ = local_128.super_execution_context.service_registry_;
      if (local_128.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar4.service_registry_ = (service_registry *)0x0;
        goto LAB_00114299;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar4.service_registry_)->mutex_);
LAB_00114299:
  operator_delete(eVar4.service_registry_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"main process exit.... ",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    // SIGINT handler
    signal(SIGINT, [](int sig) {
        g_running = false;
        std::cout << "ctrl+c is pressed .. exit...." <<std::endl;
    });
    
    try {
        asio::io_context io_context;
        tcp::acceptor acceptor(io_context, tcp::endpoint(tcp::v4(), 8899));
        
        std::cout << "loccal addr info: \n addr: " << acceptor.local_endpoint().address() << std::endl;
        std::cout << "port: " << acceptor.local_endpoint().port() << std::endl;
        
        while (g_running) {
            tcp::socket client(io_context);
            acceptor.accept(client);
            std::string message = make_daytime_string();
            std::cout << "msg : " << message  <<std::endl;
            std::cout << "peer client addr = " << client.remote_endpoint().address() << std::endl;

            asio::error_code ignored_error;
            asio::write(client, asio::buffer(message), ignored_error);
            //socket.read_some(asio::buffer(message));   //sync
        }
     } catch (std::exception& e) {
         std::cerr << e.what() << std::endl;
     }

     std::cout << "main process exit.... " <<std::endl;
     return 0;
}